

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_ar.c
# Opt level: O0

int archive_read_format_ar_read_data(archive_read *a,void **buff,size_t *size,int64_t *offset)

{
  long *plVar1;
  void *pvVar2;
  int64_t iVar3;
  long *in_RCX;
  long *in_RDX;
  undefined8 *in_RSI;
  archive *in_RDI;
  int64_t skipped;
  ar *ar;
  ssize_t bytes_read;
  size_t in_stack_ffffffffffffffb8;
  archive_read *in_stack_ffffffffffffffc0;
  long local_30;
  int local_4;
  
  plVar1 = *(long **)in_RDI[0x15].archive_format_name;
  if (plVar1[1] != 0) {
    __archive_read_consume(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    plVar1[1] = 0;
  }
  if (*plVar1 < 1) {
    iVar3 = __archive_read_consume(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    if (-1 < iVar3) {
      plVar1[3] = plVar1[3] - iVar3;
    }
    if (plVar1[3] == 0) {
      *in_RSI = 0;
      *in_RDX = 0;
      *in_RCX = plVar1[2];
      local_4 = 1;
    }
    else {
      if (-1 < iVar3) {
        archive_set_error(in_RDI,-1,"Truncated ar archive- failed consuming padding");
      }
      local_4 = -0x1e;
    }
  }
  else {
    pvVar2 = __archive_read_ahead
                       (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,(ssize_t *)0x13f42b);
    *in_RSI = pvVar2;
    if (local_30 == 0) {
      archive_set_error(in_RDI,-1,"Truncated ar archive");
      local_4 = -0x1e;
    }
    else if (local_30 < 0) {
      local_4 = -0x1e;
    }
    else {
      if (*plVar1 < local_30) {
        local_30 = *plVar1;
      }
      *in_RDX = local_30;
      plVar1[1] = local_30;
      *in_RCX = plVar1[2];
      plVar1[2] = local_30 + plVar1[2];
      *plVar1 = *plVar1 - local_30;
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

static int
archive_read_format_ar_read_data(struct archive_read *a,
    const void **buff, size_t *size, int64_t *offset)
{
	ssize_t bytes_read;
	struct ar *ar;

	ar = (struct ar *)(a->format->data);

	if (ar->entry_bytes_unconsumed) {
		__archive_read_consume(a, ar->entry_bytes_unconsumed);
		ar->entry_bytes_unconsumed = 0;
	}

	if (ar->entry_bytes_remaining > 0) {
		*buff = __archive_read_ahead(a, 1, &bytes_read);
		if (bytes_read == 0) {
			archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
			    "Truncated ar archive");
			return (ARCHIVE_FATAL);
		}
		if (bytes_read < 0)
			return (ARCHIVE_FATAL);
		if (bytes_read > ar->entry_bytes_remaining)
			bytes_read = (ssize_t)ar->entry_bytes_remaining;
		*size = bytes_read;
		ar->entry_bytes_unconsumed = bytes_read;
		*offset = ar->entry_offset;
		ar->entry_offset += bytes_read;
		ar->entry_bytes_remaining -= bytes_read;
		return (ARCHIVE_OK);
	} else {
		int64_t skipped = __archive_read_consume(a, ar->entry_padding);
		if (skipped >= 0) {
			ar->entry_padding -= skipped;
		}
		if (ar->entry_padding) {
			if (skipped >= 0) {
				archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
					"Truncated ar archive- failed consuming padding");
			}
			return (ARCHIVE_FATAL);
		}
		*buff = NULL;
		*size = 0;
		*offset = ar->entry_offset;
		return (ARCHIVE_EOF);
	}
}